

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS ref_split_edge_pattern(REF_GRID ref_grid,REF_INT first,REF_INT skip)

{
  REF_INT node0;
  REF_INT node1;
  REF_NODE pRVar1;
  uint uVar2;
  long lVar3;
  REF_INT new_node;
  REF_BOOL allowed;
  REF_EDGE ref_edge;
  REF_GLOB global;
  REF_INT local_58;
  int local_54;
  REF_NODE local_50;
  REF_EDGE local_48;
  long local_40;
  REF_GLOB local_38;
  
  pRVar1 = ref_grid->node;
  uVar2 = ref_edge_create(&local_48,ref_grid);
  if (uVar2 == 0) {
    if (first < local_48->n) {
      lVar3 = (long)first;
      local_40 = (long)skip;
      local_50 = pRVar1;
      do {
        node0 = local_48->e2n[lVar3 * 2];
        node1 = local_48->e2n[lVar3 * 2 + 1];
        uVar2 = ref_cell_has_side(ref_grid->cell[8],node0,node1,&local_54);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x389,"ref_split_edge_pattern",(ulong)uVar2,"has side");
          return uVar2;
        }
        if (local_54 != 0) {
          uVar2 = ref_split_edge_mixed(ref_grid,node0,node1,&local_54);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x38c,"ref_split_edge_pattern",(ulong)uVar2,"mixed");
            return uVar2;
          }
          if (local_54 != 0) {
            uVar2 = ref_cell_local_gem(ref_grid->cell[8],local_50,node0,node1,&local_54);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x391,"ref_split_edge_pattern",(ulong)uVar2,"local tet");
              return uVar2;
            }
            if (local_54 != 0) {
              uVar2 = ref_node_next_global(local_50,&local_38);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x394,"ref_split_edge_pattern",(ulong)uVar2,"next global");
                return uVar2;
              }
              uVar2 = ref_node_add(local_50,local_38,&local_58);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x395,"ref_split_edge_pattern",(ulong)uVar2,"new node");
                return uVar2;
              }
              uVar2 = ref_node_interpolate_edge(local_50,node0,node1,0.5,local_58);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x397,"ref_split_edge_pattern",(ulong)uVar2,"interp new node");
                return uVar2;
              }
              uVar2 = ref_geom_add_between(ref_grid,node0,node1,0.5,local_58);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x399,"ref_split_edge_pattern",(ulong)uVar2,"geom new node");
                return uVar2;
              }
              uVar2 = ref_geom_constrain(ref_grid,local_58);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x39a,"ref_split_edge_pattern",(ulong)uVar2,"geom constraint");
                return uVar2;
              }
              uVar2 = ref_metric_interpolate_between(ref_grid,node0,node1,local_58);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x39c,"ref_split_edge_pattern",(ulong)uVar2,"interp new node metric");
                return uVar2;
              }
              uVar2 = ref_split_edge(ref_grid,node0,node1,local_58);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x39e,"ref_split_edge_pattern",(ulong)uVar2,"split");
                return uVar2;
              }
            }
          }
        }
        lVar3 = lVar3 + local_40;
      } while (lVar3 < local_48->n);
    }
    ref_edge_free(local_48);
    uVar2 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",899,
           "ref_split_edge_pattern",(ulong)uVar2,"orig edges");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_pattern(REF_GRID ref_grid, REF_INT first,
                                          REF_INT skip) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge;
  REF_BOOL allowed;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  for (edge = first; edge < ref_edge_n(ref_edge); edge += skip) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
        "has side");
    if (!allowed) continue;

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (!allowed) continue;

    RSS(ref_cell_local_gem(ref_grid_tet(ref_grid), ref_node, node0, node1,
                           &allowed),
        "local tet");
    if (!allowed) continue;

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");

    RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}